

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O3

size_t bitset_extract_setbits_avx512
                 (uint64_t *words,size_t length,uint32_t *vout,size_t outcapacity,uint32_t base)

{
  undefined1 (*pauVar1) [64];
  int iVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  undefined1 (*pauVar5) [64];
  ulong uVar6;
  long lVar7;
  uint64_t uVar8;
  int iVar9;
  undefined1 (*pauVar10) [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  
  pauVar1 = (undefined1 (*) [64])(vout + outcapacity);
  if ((long)outcapacity < 0x41 || length == 0) {
    uVar6 = 0;
    pauVar5 = (undefined1 (*) [64])vout;
  }
  else {
    auVar12 = vmovdqa64_avx512f((undefined1  [64])vbmi2_table);
    uVar6 = 0;
    pauVar10 = (undefined1 (*) [64])vout;
    do {
      lVar7 = POPCOUNT(words[uVar6]);
      auVar13 = vpcompressb_avx512_vbmi2(auVar12,words[uVar6]);
      auVar14 = vpbroadcastd_avx512f();
      auVar15 = vpmovsxbd_avx512f(auVar13._0_16_);
      auVar16 = vpmovsxbd_avx512f(auVar13._16_16_);
      auVar11 = vextracti32x4_avx512f(auVar13,2);
      auVar17 = vpmovsxbd_avx512f(auVar11);
      auVar11 = vextracti32x4_avx512f(auVar13,3);
      auVar13 = vpmovsxbd_avx512f(auVar11);
      auVar15 = vpaddd_avx512f(auVar14,auVar15);
      auVar16 = vpaddd_avx512f(auVar14,auVar16);
      auVar17 = vpaddd_avx512f(auVar14,auVar17);
      auVar14 = vpaddd_avx512f(auVar14,auVar13);
      auVar13 = vmovdqu64_avx512f(auVar15);
      *pauVar10 = auVar13;
      auVar13 = vmovdqu64_avx512f(auVar16);
      pauVar10[1] = auVar13;
      auVar13 = vmovdqu64_avx512f(auVar17);
      pauVar10[2] = auVar13;
      auVar13 = vmovdqu64_avx512f(auVar14);
      pauVar10[3] = auVar13;
      pauVar5 = (undefined1 (*) [64])(*pauVar10 + lVar7 * 4);
      uVar6 = uVar6 + 1;
      if (length <= uVar6) break;
      pauVar4 = pauVar10 + 4;
      pauVar10 = pauVar5;
    } while ((undefined1 (*) [64])(*pauVar4 + lVar7 * 4) < pauVar1);
  }
  if ((uVar6 < length) && (pauVar5 < pauVar1)) {
    iVar9 = (int)uVar6 * 0x40 + base;
    do {
      uVar8 = words[uVar6];
      if (uVar8 != 0) {
        do {
          iVar2 = 0;
          for (uVar3 = uVar8; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
            iVar2 = iVar2 + 1;
          }
          *(int *)*pauVar5 = iVar2 + iVar9;
          pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
          uVar8 = uVar8 - 1 & uVar8;
        } while ((uVar8 != 0) && (pauVar5 < pauVar1));
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 < length) && (iVar9 = iVar9 + 0x40, pauVar5 < pauVar1));
  }
  return (long)pauVar5 - (long)vout >> 2;
}

Assistant:

size_t bitset_extract_setbits_avx512(const uint64_t *words, size_t length,
                                     uint32_t *vout, size_t outcapacity,
                                     uint32_t base) {
    uint32_t *out = (uint32_t *)vout;
    uint32_t *initout = out;
    uint32_t *safeout = out + outcapacity;
    __m512i base_v = _mm512_set1_epi32(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i += 1) {
        uint64_t v = words[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi32(base_v, _mm512_set1_epi32((int)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 1));
        __m512i r3 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 2));
        __m512i r4 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 3));

        r1 = _mm512_add_epi32(r1, vbase);
        r2 = _mm512_add_epi32(r2, vbase);
        r3 = _mm512_add_epi32(r3, vbase);
        r4 = _mm512_add_epi32(r4, vbase);
        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 16), r2);
        _mm512_storeu_si512((__m512i *)(out + 32), r3);
        _mm512_storeu_si512((__m512i *)(out + 48), r4);

        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            out++;
            w &= (w - 1);
        }
        base += 64;
    }

    return out - initout;
}